

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbridge.c
# Opt level: O2

boolean e_jumps(entity *etmp)

{
  uint uVar1;
  monst *pmVar2;
  int iVar3;
  int iVar4;
  
  pmVar2 = etmp->emon;
  if (pmVar2 == &youmonst) {
    if (u.uprops[0x1f].intrinsic != 0) {
      return '\0';
    }
    if (u.uprops[0x1f].extrinsic != 0) {
      return '\0';
    }
    if (u.uprops[0x25].intrinsic != 0) {
      return '\0';
    }
    if (u.uprops[0x25].extrinsic != 0) {
      return '\0';
    }
    iVar3 = (uint)(u.uprops[0x1c].intrinsic == 0) * 2 + 2;
    if (((u.uprops[0x1b].intrinsic == 0) && (u.umonnum != 0x9e)) &&
       ((youmonst.data)->mlet != '\x1c')) goto LAB_0015dc9f;
  }
  else {
    uVar1 = *(uint *)&pmVar2->field_0x60;
    if ((((uVar1 & 0xc0000) != 0x40000) || (etmp->edata->mmove == '\0')) || (pmVar2->wormno != '\0')
       ) {
      return '\0';
    }
    iVar3 = (uint)((uVar1 >> 0x15 & 1) == 0) * 2 + 2;
    if ((uVar1 >> 0x14 & 1) == 0) goto LAB_0015dc9f;
  }
  iVar3 = iVar3 + -3;
LAB_0015dc9f:
  iVar4 = iVar3 + -2;
  if (level->locations[etmp->ex][etmp->ey].typ != '\f') {
    iVar4 = iVar3;
  }
  iVar3 = rnd(10);
  return iVar3 <= iVar4;
}

Assistant:

static boolean e_jumps(struct entity *etmp)
{
	int tmp = 4;		/* out of 10 */

	if (is_u(etmp)? (Sleeping || Fumbling) :
		        (!etmp->emon->mcanmove || etmp->emon->msleeping ||
			 !etmp->edata->mmove   || etmp->emon->wormno))
		return FALSE;

	if (is_u(etmp)? Confusion : etmp->emon->mconf)
		tmp -= 2;

	if (is_u(etmp)? Stunned : etmp->emon->mstun)
		tmp -= 3;

	if (is_db_wall(etmp->ex, etmp->ey))
		tmp -= 2;			    /* less room to maneuver */

	return (boolean)((tmp >= rnd(10))? TRUE : FALSE);
}